

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::IsUnsignedIntScalarOrVectorType
          (ValidationState_t *this,uint32_t id)

{
  Op OVar1;
  uint uVar2;
  uint32_t id_00;
  Instruction *this_00;
  Instruction *inst;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  this_00 = FindDef(this,id);
  if (this_00 == (Instruction *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    OVar1 = Instruction::opcode(this_00);
    if (OVar1 == OpTypeInt) {
      uVar2 = Instruction::GetOperandAs<unsigned_int>(this_00,2);
      this_local._7_1_ = uVar2 == 0;
    }
    else {
      OVar1 = Instruction::opcode(this_00);
      if (OVar1 == OpTypeVector) {
        id_00 = GetComponentType(this,id);
        this_local._7_1_ = IsUnsignedIntScalarType(this,id_00);
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ValidationState_t::IsUnsignedIntScalarOrVectorType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    return false;
  }

  if (inst->opcode() == spv::Op::OpTypeInt) {
    return inst->GetOperandAs<uint32_t>(2) == 0;
  }

  if (inst->opcode() == spv::Op::OpTypeVector) {
    return IsUnsignedIntScalarType(GetComponentType(id));
  }

  return false;
}